

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall
cmListCommand::HandleTransformCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  pointer pbVar2;
  pointer pcVar3;
  _Link_type p_Var4;
  cmMakefile *pcVar5;
  TransformAction TVar6;
  pointer pbVar7;
  pointer __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  code *pcVar9;
  _Base_ptr *pp_Var10;
  _func_int ***ppp_Var11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  _Link_type p_Var17;
  ostream *poVar18;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Var19;
  int *piVar20;
  long lVar21;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> _Var22;
  undefined8 uVar23;
  undefined **ppuVar24;
  runtime_error *prVar25;
  _Rb_tree_node_base *p_Var26;
  long lVar27;
  _Rb_tree_node_base *p_Var28;
  _Link_type __p;
  _Link_type p_Var29;
  _Base_ptr p_Var30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  _Link_type this_00;
  _Rb_tree_node_base *p_Var34;
  pointer pbVar35;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string REGEX;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  ostringstream error;
  string FOR;
  string OUTPUT_VARIABLE;
  int value;
  _Link_type local_5b8;
  _Base_ptr local_5a0;
  undefined1 local_598 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  long *local_550;
  pointer local_548;
  long local_540 [2];
  undefined1 *local_530;
  undefined8 local_528;
  undefined1 local_520;
  undefined7 uStack_51f;
  undefined8 uStack_518;
  undefined1 *local_510;
  undefined8 local_508;
  undefined1 local_500;
  undefined7 uStack_4ff;
  undefined8 uStack_4f8;
  _Any_data local_4f0;
  long local_4e0;
  code *local_4d8;
  undefined1 local_4d0 [48];
  size_t local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  uchar local_478;
  uchar auStack_477 [7];
  uchar auStack_470 [8];
  undefined1 *local_468;
  undefined8 local_460;
  undefined1 local_458;
  undefined7 uStack_457;
  undefined8 uStack_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined1 local_438;
  undefined7 uStack_437;
  undefined8 uStack_430;
  undefined1 *local_428;
  undefined8 local_420;
  undefined1 local_418;
  undefined7 uStack_417;
  undefined8 uStack_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_408;
  undefined8 local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Any_data local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined4 local_3c8 [2];
  Command *local_3c0;
  undefined8 uStack_3b8;
  code *local_3b0;
  code *pcStack_3a8;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390 [8];
  undefined8 uStack_388;
  undefined4 local_380;
  Command *local_378;
  undefined8 uStack_370;
  code *local_368;
  code *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  undefined4 local_338;
  Command *local_330;
  undefined8 uStack_328;
  code *local_320;
  code *local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined4 local_2f0;
  Command *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  code *local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  Command *local_2a0;
  undefined8 uStack_298;
  code *local_290;
  code *local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270 [8];
  undefined8 uStack_268;
  undefined4 local_260;
  Command *local_258;
  undefined8 uStack_250;
  code *local_248;
  code *local_240;
  long *local_238;
  uchar local_230 [8];
  long local_228;
  uchar auStack_220 [8];
  undefined4 local_218;
  Command *local_210;
  undefined8 uStack_208;
  code *local_200 [2];
  undefined1 local_1f0 [32];
  string local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Stack_198;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> local_190;
  string local_188;
  long *local_168;
  pointer local_160;
  long local_158 [2];
  long *local_148;
  pointer local_140;
  long local_138 [2];
  long local_128;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_120;
  Command *local_110;
  undefined8 uStack_108;
  code *pcStack_100;
  undefined8 uStack_f8;
  Command *local_f0;
  undefined8 uStack_e8;
  code *pcStack_e0;
  undefined8 uStack_d8;
  Command *local_d0;
  undefined8 uStack_c8;
  code *pcStack_c0;
  undefined8 uStack_b8;
  Command *local_b0;
  undefined8 uStack_a8;
  code *pcStack_a0;
  undefined8 uStack_98;
  Command *local_90;
  undefined8 uStack_88;
  code *pcStack_80;
  undefined8 uStack_78;
  Command *local_70;
  undefined8 uStack_68;
  code *pcStack_60;
  undefined8 uStack_58;
  Command *local_50;
  undefined8 uStack_48;
  code *pcStack_40;
  undefined8 uStack_38;
  
  pbVar35 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar35) < 0x41) {
    local_3e8._M_unused._M_object = &local_3d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e8,"sub-command TRANSFORM requires an action to be specified.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_unused._0_8_ != &local_3d8) {
      operator_delete(local_3e8._M_unused._M_object,
                      CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                               CONCAT15(local_3d8._M_local_buf[5],
                                        CONCAT14(local_3d8._M_local_buf[4],
                                                 CONCAT13(local_3d8._M_local_buf[3],
                                                          CONCAT12(local_3d8._M_local_buf[2],
                                                                   CONCAT11(local_3d8._M_local_buf
                                                                            [1],local_3d8.
                                                                                _M_local_buf[0])))))
                              ) + 1);
    }
    return false;
  }
  local_1f0._0_8_ = &(((Command *)local_1f0)->Name).field_2;
  local_1f0._8_8_ = 0;
  local_1f0[0x10] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&(((Command *)local_1f0)->ListName).field_2;
  pcVar3 = pbVar35[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_1f0)->ListName,pcVar3,pcVar3 + pbVar35[1]._M_string_length
            );
  local_188._M_dataplus._M_p = (pointer)&(((Command *)local_1f0)->OutputName).field_2;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_198._M_head_impl = (TransformAction *)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_190._M_head_impl = (TransformSelector *)0x0;
  pcVar3 = pbVar35[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_1f0)->OutputName,pcVar3,
             pcVar3 + pbVar35[1]._M_string_length);
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8._8_5_ = 0x27e76a;
  local_3d8._13_2_ = 0;
  local_3d8._M_local_buf[0xf] = '\0';
  local_3d8._M_local_buf[0] = -0x7c;
  local_3d8._M_local_buf[1] = -0x19;
  local_3d8._M_local_buf[2] = '\'';
  local_3d8._M_local_buf[3] = '\0';
  local_3d8._M_local_buf[4] = '\0';
  local_3d8._M_local_buf[5] = '\0';
  local_3d8._M_allocated_capacity._6_2_ = 0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_4f0,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_3e8);
  local_4d0._16_8_ = local_4d0;
  local_4d0._0_4_ = _S_red;
  local_4d0._8_8_ = (_Base_ptr)0x0;
  local_4d0[0x20] = '\0';
  local_4d0[0x21] = '\0';
  local_4d0[0x22] = '\0';
  local_4d0[0x23] = '\0';
  local_4d0[0x24] = '\0';
  local_4d0[0x25] = '\0';
  local_4d0[0x26] = '\0';
  local_4d0[0x27] = '\0';
  pcVar9 = (code *)CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                            CONCAT15(local_3d8._M_local_buf[5],
                                     CONCAT14(local_3d8._M_local_buf[4],
                                              CONCAT13(local_3d8._M_local_buf[3],
                                                       CONCAT12(local_3d8._M_local_buf[2],
                                                                CONCAT11(local_3d8._M_local_buf[1],
                                                                         local_3d8._M_local_buf[0]))
                                                      ))));
  local_4d0._24_8_ = local_4d0._16_8_;
  if (pcVar9 != (code *)0x0) {
    (*pcVar9)(&local_3e8,&local_3e8,3);
  }
  local_408 = &local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"APPEND","");
  uStack_48 = 0;
  local_3e8._M_unused._M_object = &local_3d8;
  local_3d8._M_local_buf[2] = (char)((uint7)local_3f8._1_7_ >> 8);
  local_3d8._M_local_buf[3] = (char)((uint7)local_3f8._1_7_ >> 0x10);
  local_3d8._M_local_buf[4] = (char)((uint7)local_3f8._1_7_ >> 0x18);
  local_3d8._M_local_buf[5] = (char)((uint7)local_3f8._1_7_ >> 0x20);
  local_3d8._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_3f8._1_7_ >> 0x28);
  if (local_408 == &local_3f8) {
    local_3d8._8_5_ = (undefined5)local_3f8._8_8_;
    local_3d8._13_2_ = (undefined2)((ulong)local_3f8._8_8_ >> 0x28);
    local_3d8._M_local_buf[0xf] = (char)((ulong)local_3f8._8_8_ >> 0x38);
  }
  else {
    local_3e8._M_unused._M_object = local_408;
  }
  local_3d8._M_local_buf[1] = (char)local_3f8._M_allocated_capacity._1_7_;
  local_3e8._8_8_ = local_400;
  local_400 = 0;
  local_3f8._M_local_buf[0] = '\0';
  local_3c8[0] = 1;
  pcStack_3a8 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:822:21)>
                ::_M_invoke;
  uStack_3b8 = 0;
  local_3b0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:822:21)>
              ::_M_manager;
  pcStack_40 = (code *)0x0;
  uStack_38 = 0;
  local_428 = &local_418;
  local_408 = &local_3f8;
  local_3c0 = (Command *)local_1f0;
  local_50 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"PREPEND","");
  uStack_68 = 0;
  local_3a0 = local_390;
  if (local_428 == &local_418) {
    uStack_388 = uStack_410;
  }
  else {
    local_3a0 = local_428;
  }
  local_398 = local_420;
  local_420 = 0;
  local_418 = 0;
  local_380 = 1;
  local_360 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:830:21)>
              ::_M_invoke;
  uStack_370 = 0;
  local_368 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:830:21)>
              ::_M_manager;
  pcStack_60 = (code *)0x0;
  uStack_58 = 0;
  local_448 = &local_438;
  local_428 = &local_418;
  local_378 = (Command *)local_1f0;
  local_70 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"TOUPPER","");
  uStack_88 = 0;
  local_358 = local_348;
  if (local_448 == &local_438) {
    uStack_340 = uStack_430;
  }
  else {
    local_358 = local_448;
  }
  local_350 = local_440;
  local_440 = 0;
  local_438 = 0;
  local_338 = 0;
  local_318 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:838:21)>
              ::_M_invoke;
  uStack_328 = 0;
  local_320 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:838:21)>
              ::_M_manager;
  pcStack_80 = (code *)0x0;
  uStack_78 = 0;
  local_510 = &local_500;
  local_448 = &local_438;
  local_330 = (Command *)local_1f0;
  local_90 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"TOLOWER","");
  uStack_a8 = 0;
  local_310 = local_300;
  if (local_510 == &local_500) {
    uStack_2f8 = uStack_4f8;
  }
  else {
    local_310 = local_510;
  }
  local_308 = local_508;
  local_508 = 0;
  local_500 = 0;
  local_2f0 = 0;
  local_2d0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:846:21)>
              ::_M_invoke;
  uStack_2e0 = 0;
  local_2d8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:846:21)>
              ::_M_manager;
  pcStack_a0 = (code *)0x0;
  uStack_98 = 0;
  local_530 = &local_520;
  local_510 = &local_500;
  local_2e8 = (Command *)local_1f0;
  local_b0 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"STRIP","");
  uStack_c8 = 0;
  local_2c8 = local_2b8;
  if (local_530 == &local_520) {
    uStack_2b0 = uStack_518;
  }
  else {
    local_2c8 = local_530;
  }
  local_2c0 = local_528;
  local_528 = 0;
  local_520 = 0;
  local_2a8 = 0;
  local_288 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:854:21)>
              ::_M_invoke;
  uStack_298 = 0;
  local_290 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:854:21)>
              ::_M_manager;
  pcStack_c0 = (code *)0x0;
  uStack_b8 = 0;
  local_530 = &local_520;
  local_468 = &local_458;
  local_2a0 = (Command *)local_1f0;
  local_d0 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"GENEX_STRIP","");
  uStack_e8 = 0;
  local_280 = local_270;
  if (local_468 == &local_458) {
    uStack_268 = uStack_450;
  }
  else {
    local_280 = local_468;
  }
  local_278 = local_460;
  local_460 = 0;
  local_458 = 0;
  local_260 = 0;
  local_240 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:862:21)>
              ::_M_invoke;
  uStack_250 = 0;
  local_248 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:862:21)>
              ::_M_manager;
  pcStack_e0 = (code *)0x0;
  uStack_d8 = 0;
  __p = (_Link_type)0x559784;
  local_488._M_allocated_capacity = (size_type)&local_478;
  local_468 = &local_458;
  local_258 = (Command *)local_1f0;
  local_f0 = (Command *)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"REPLACE","");
  uStack_108 = 0;
  local_238 = &local_228;
  if ((uchar *)local_488._M_allocated_capacity == &local_478) {
    auStack_220[0] = auStack_470[0];
    auStack_220[1] = auStack_470[1];
    auStack_220[2] = auStack_470[2];
    auStack_220[3] = auStack_470[3];
    auStack_220[4] = auStack_470[4];
    auStack_220[5] = auStack_470[5];
    auStack_220[6] = auStack_470[6];
    auStack_220[7] = auStack_470[7];
  }
  else {
    local_238 = (long *)local_488._M_allocated_capacity;
  }
  local_230[0] = local_488._M_local_buf[8];
  local_230[1] = local_488._M_local_buf[9];
  local_230[2] = local_488._M_local_buf[10];
  local_230[3] = local_488._M_local_buf[0xb];
  local_230[4] = local_488._M_local_buf[0xc];
  local_230[5] = local_488._M_local_buf[0xd];
  local_230[6] = local_488._M_local_buf[0xe];
  local_230[7] = local_488._M_local_buf[0xf];
  local_488._M_local_buf[8] = '\0';
  local_488._M_local_buf[9] = '\0';
  local_488._M_local_buf[10] = '\0';
  local_488._M_local_buf[0xb] = '\0';
  local_488._M_local_buf[0xc] = '\0';
  local_488._M_local_buf[0xd] = '\0';
  local_488._M_local_buf[0xe] = '\0';
  local_488._M_local_buf[0xf] = '\0';
  local_478 = '\0';
  local_218 = 2;
  local_200[1] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:872:21)>
                 ::_M_invoke;
  uStack_208 = 0;
  local_200[0] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx:872:21)>
                 ::_M_manager;
  pcStack_100 = (code *)0x0;
  uStack_f8 = 0;
  local_5a0 = (_Base_ptr)local_4d0._8_8_;
  if ((_Base_ptr)local_4d0._8_8_ == (_Base_ptr)0x0) {
    this_00 = (_Link_type)0x0;
  }
  else {
    *(_Base_ptr *)(local_4d0._8_8_ + 8) = (_Base_ptr)0x0;
    this_00 = (_Link_type)((_Rb_tree_node_base *)local_4d0._24_8_)->_M_left;
    if (this_00 == (_Link_type)0x0) {
      this_00 = (_Link_type)local_4d0._24_8_;
    }
  }
  local_4d0._8_8_ = (_Rb_tree_node_base *)0x0;
  local_4d0._16_8_ = local_4d0;
  local_4d0._32_8_ = 0;
  lVar27 = 0;
  local_4d0._24_8_ = local_4d0._16_8_;
  local_488._M_allocated_capacity = (size_type)&local_478;
  local_210 = (Command *)local_1f0;
  local_110 = (Command *)local_1f0;
  do {
    p_Var29 = (_Link_type)((long)&local_3e8 + lVar27);
    if (local_4d0._32_8_ == 0) {
LAB_00279c93:
      p_Var26 = (_Rb_tree_node_base *)local_4d0;
      p_Var30 = (_Base_ptr)local_4d0._8_8_;
      if ((_Rb_tree_node_base *)local_4d0._8_8_ == (_Rb_tree_node_base *)0x0) {
LAB_00279ce4:
        if (p_Var26 != (_Rb_tree_node_base *)local_4d0._16_8_) {
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var26);
          goto LAB_00279cf9;
        }
LAB_00279d2d:
        bVar13 = false;
      }
      else {
        do {
          p_Var26 = p_Var30;
          if (local_4e0 == 0) goto LAB_0027b27e;
          __p = p_Var29;
          bVar13 = (*local_4d8)(&local_4f0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(p_Var26 + 1));
          p_Var30 = (&p_Var26->_M_left)[!bVar13];
        } while ((&p_Var26->_M_left)[!bVar13] != (_Base_ptr)0x0);
        p_Var16 = p_Var26;
        if (bVar13) goto LAB_00279ce4;
LAB_00279cf9:
        if (local_4e0 == 0) {
LAB_0027b27e:
          std::__throw_bad_function_call();
        }
        __p = (_Link_type)(p_Var16 + 1);
        bVar13 = (*local_4d8)(&local_4f0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var29);
        if (!bVar13) goto LAB_00279e51;
        bVar13 = p_Var16 != (_Rb_tree_node_base *)0x0 && !bVar13;
      }
      bVar14 = true;
      if ((!bVar13) && ((_Rb_tree_node_base *)local_4d0 != p_Var26)) {
        if (local_4e0 == 0) {
LAB_0027b298:
          std::__throw_bad_function_call();
        }
        __p = p_Var29;
        bVar14 = (*local_4d8)(&local_4f0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var29,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var26 + 1));
      }
      if (this_00 == (_Link_type)0x0) {
        __p = (_Link_type)operator_new(0x68);
        local_5b8 = (_Link_type)0x0;
      }
      else {
        local_5b8 = (_Link_type)(this_00->super__Rb_tree_node_base)._M_parent;
        if (local_5b8 == (_Link_type)0x0) {
          local_5a0 = (_Base_ptr)0x0;
          local_5b8 = (_Link_type)0x0;
        }
        else if ((_Link_type)(local_5b8->super__Rb_tree_node_base)._M_right == this_00) {
          (local_5b8->super__Rb_tree_node_base)._M_right = (_Base_ptr)0x0;
          p_Var4 = (_Link_type)(local_5b8->super__Rb_tree_node_base)._M_left;
          if (p_Var4 != (_Link_type)0x0) {
            do {
              p_Var17 = p_Var4;
              p_Var4 = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_right;
            } while (p_Var4 != (_Link_type)0x0);
            local_5b8 = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_left;
            if (local_5b8 == (_Link_type)0x0) {
              local_5b8 = p_Var17;
            }
          }
        }
        else {
          (local_5b8->super__Rb_tree_node_base)._M_left = (_Base_ptr)0x0;
        }
        std::
        _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
        ::_M_destroy_node((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                           *)this_00,__p);
        __p = this_00;
      }
      *(uchar **)(__p->_M_storage)._M_storage = (__p->_M_storage)._M_storage + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__p->_M_storage,*(long *)&p_Var29->super__Rb_tree_node_base,
                 *(long *)((long)&local_3e8 + lVar27 + 8) +
                 *(long *)&p_Var29->super__Rb_tree_node_base);
      *(undefined4 *)((__p->_M_storage)._M_storage + 0x20) =
           *(undefined4 *)((long)local_3c8 + lVar27);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)((__p->_M_storage)._M_storage + 0x28),
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)((long)local_3c8 + lVar27 + 8));
      std::_Rb_tree_insert_and_rebalance
                (bVar14,&__p->super__Rb_tree_node_base,p_Var26,(_Rb_tree_node_base *)local_4d0);
      local_4d0._32_8_ = local_4d0._32_8_ + 1;
      this_00 = local_5b8;
    }
    else {
      if (local_4e0 == 0) goto LAB_0027b298;
      __p = (_Link_type)(local_4d0._24_8_ + 0x20);
      bVar13 = (*local_4d8)(&local_4f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__p
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var29);
      if (!bVar13) goto LAB_00279c93;
      p_Var26 = (_Rb_tree_node_base *)local_4d0._24_8_;
      if ((_Rb_tree_node_base *)local_4d0._24_8_ != (_Rb_tree_node_base *)0x0) goto LAB_00279d2d;
    }
LAB_00279e51:
    lVar27 = lVar27 + 0x48;
  } while (lVar27 != 0x1f8);
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_M_erase((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
              *)local_5a0,__p);
  lVar27 = 0;
  do {
    if (*(code **)((long)local_200 + lVar27) != (code *)0x0) {
      (**(code **)((long)local_200 + lVar27))((long)&local_210 + lVar27,(long)&local_210 + lVar27,3)
      ;
    }
    if ((void *)((long)&local_228 + lVar27) != *(void **)((long)&local_238 + lVar27)) {
      operator_delete(*(void **)((long)&local_238 + lVar27),*(long *)((long)&local_228 + lVar27) + 1
                     );
    }
    lVar27 = lVar27 + -0x48;
  } while (lVar27 != -0x1f8);
  if (pcStack_100 != (code *)0x0) {
    (*pcStack_100)(&local_110,&local_110,3);
  }
  if ((uchar *)local_488._M_allocated_capacity != &local_478) {
    operator_delete((void *)local_488._M_allocated_capacity,CONCAT71(auStack_477,local_478) + 1);
  }
  if (pcStack_e0 != (code *)0x0) {
    (*pcStack_e0)(&local_f0,&local_f0,3);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,CONCAT71(uStack_457,local_458) + 1);
  }
  if (pcStack_c0 != (code *)0x0) {
    (*pcStack_c0)(&local_d0,&local_d0,3);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,CONCAT71(uStack_51f,local_520) + 1);
  }
  if (pcStack_a0 != (code *)0x0) {
    (*pcStack_a0)(&local_b0,&local_b0,3);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,CONCAT71(uStack_4ff,local_500) + 1);
  }
  if (pcStack_80 != (code *)0x0) {
    (*pcStack_80)(&local_90,&local_90,3);
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,CONCAT71(uStack_437,local_438) + 1);
  }
  if (pcStack_60 != (code *)0x0) {
    (*pcStack_60)(&local_70,&local_70,3);
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
  }
  if (pcStack_40 != (code *)0x0) {
    (*pcStack_40)(&local_50,&local_50,3);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,
                    CONCAT71(local_3f8._M_allocated_capacity._1_7_,local_3f8._M_local_buf[0]) + 1);
  }
  pbVar35 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar35[2]._M_dataplus._M_p;
  local_4d0._40_8_ = &local_498;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_4d0 + 0x28),pcVar3,pcVar3 + pbVar35[2]._M_string_length);
  local_3d8._M_local_buf[2] = (char)((uint7)local_498._1_7_ >> 8);
  local_3d8._M_local_buf[3] = (char)((uint7)local_498._1_7_ >> 0x10);
  local_3d8._M_local_buf[4] = (char)((uint7)local_498._1_7_ >> 0x18);
  local_3d8._M_local_buf[5] = (char)((uint7)local_498._1_7_ >> 0x20);
  local_3d8._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_498._1_7_ >> 0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._40_8_ == &local_498) {
    local_3d8._8_5_ = (undefined5)local_498._8_8_;
    local_3d8._13_2_ = (undefined2)((ulong)local_498._8_8_ >> 0x28);
    local_3d8._M_local_buf[0xf] = (char)((ulong)local_498._8_8_ >> 0x38);
    local_3e8._M_unused._M_object = &local_3d8;
  }
  else {
    local_3e8._M_unused._M_object = (void *)local_4d0._40_8_;
  }
  local_3d8._M_local_buf[1] = (char)local_498._M_allocated_capacity._1_7_;
  local_3d8._M_local_buf[0] = local_498._M_local_buf[0];
  local_3e8._8_8_ = local_4a0;
  local_4a0._0_1_ = '\0';
  local_4a0._1_1_ = '\0';
  local_4a0._2_1_ = '\0';
  local_4a0._3_1_ = '\0';
  local_4a0._4_1_ = '\0';
  local_4a0._5_1_ = '\0';
  local_4a0._6_1_ = '\0';
  local_4a0._7_1_ = '\0';
  local_498._M_local_buf[0] = '\0';
  local_3c8[0] = 0;
  local_3c0 = (Command *)0x0;
  uStack_3b8 = 0;
  local_3b0 = (code *)0x0;
  pcStack_3a8 = (code *)0x0;
  p_Var26 = (_Rb_tree_node_base *)local_4d0;
  local_4d0._40_8_ = &local_498;
  if ((_Rb_tree_node_base *)local_4d0._8_8_ != (_Rb_tree_node_base *)0x0) {
    p_Var16 = (_Rb_tree_node_base *)local_4d0;
    p_Var30 = (_Base_ptr)local_4d0._8_8_;
    do {
      p_Var28 = p_Var16;
      if (local_4e0 == 0) goto LAB_0027b29d;
      p_Var34 = p_Var30 + 1;
      bVar13 = (*local_4d8)(&local_4f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var34,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_3e8);
      pp_Var10 = &p_Var30->_M_left;
      p_Var16 = p_Var30;
      if (bVar13) {
        p_Var16 = p_Var28;
      }
      p_Var30 = pp_Var10[bVar13];
    } while (pp_Var10[bVar13] != (_Base_ptr)0x0);
    p_Var26 = (_Rb_tree_node_base *)local_4d0;
    if (p_Var16 != (_Rb_tree_node_base *)local_4d0) {
      if (local_4e0 == 0) {
LAB_0027b29d:
        std::__throw_bad_function_call();
      }
      if (bVar13) {
        p_Var34 = p_Var28 + 1;
      }
      bVar13 = (*local_4d8)(&local_4f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_3e8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var34);
      p_Var26 = p_Var16;
      if (bVar13) {
        p_Var26 = (_Rb_tree_node_base *)local_4d0;
      }
    }
  }
  if (local_3b0 != (code *)0x0) {
    (*local_3b0)(local_3c8 + 2,local_3c8 + 2,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_unused._0_8_ != &local_3d8) {
    operator_delete(local_3e8._M_unused._M_object,
                    CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                             CONCAT15(local_3d8._M_local_buf[5],
                                      CONCAT14(local_3d8._M_local_buf[4],
                                               CONCAT13(local_3d8._M_local_buf[3],
                                                        CONCAT12(local_3d8._M_local_buf[2],
                                                                 CONCAT11(local_3d8._M_local_buf[1],
                                                                          local_3d8._M_local_buf[0])
                                                                ))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._40_8_ != &local_498) {
    operator_delete((void *)local_4d0._40_8_,
                    CONCAT71(local_498._M_allocated_capacity._1_7_,local_498._M_local_buf[0]) + 1);
  }
  if (p_Var26 == (_Rb_tree_node_base *)local_4d0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3e8," sub-command TRANSFORM, ",0x18);
    pbVar35 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3e8,pbVar35[2]._M_dataplus._M_p,
                         pbVar35[2]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," invalid action.",0x10);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_578);
  }
  else {
    if ((long)(int)p_Var26[2]._M_color + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)local_1f0);
      uVar32 = (long)(int)p_Var26[2]._M_color + 3;
      if (0 < (long)(int)p_Var26[2]._M_color) {
        pbVar35 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   local_578._M_local_buf,pbVar35 + 3,pbVar35 + uVar32,(allocator_type *)&local_550)
        ;
        pbVar35 = local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3e8._8_8_ =
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_3e8._M_unused._0_8_ =
             (undefined8)
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_568._M_allocated_capacity;
        local_1b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_578._M_allocated_capacity;
        local_1b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_578._8_8_;
        local_3d8._M_local_buf[0] = (char)pbVar35;
        local_3d8._M_local_buf[1] = (char)((ulong)pbVar35 >> 8);
        local_3d8._M_local_buf[2] = (char)((ulong)pbVar35 >> 0x10);
        local_3d8._M_local_buf[3] = (char)((ulong)pbVar35 >> 0x18);
        local_3d8._M_local_buf[4] = (char)((ulong)pbVar35 >> 0x20);
        local_3d8._M_local_buf[5] = (char)((ulong)pbVar35 >> 0x28);
        local_3d8._M_allocated_capacity._6_2_ = (undefined2)((ulong)pbVar35 >> 0x30);
        local_578._M_allocated_capacity = 0;
        local_578._8_8_ = (pointer)0x0;
        local_568._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_578);
      }
      iVar15 = std::__cxx11::string::compare((char *)local_1f0);
      _Var19._M_head_impl = (TransformAction *)_Stack_198;
      if (iVar15 == 0) {
        pcVar5 = (this->super_cmCommand).Makefile;
        _Var19._M_head_impl = (TransformAction *)operator_new(0x160);
        pbVar35 = local_1b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *_Var19._M_head_impl = (TransformAction)&PTR__TransformReplace_0069cd08;
        local_578._M_allocated_capacity = (size_type)&local_568;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_578,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_1b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity,
                   *(long *)((long)local_1b0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x28) +
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_1b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity);
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)((long)_Var19._M_head_impl + 8),pbVar35,
                   (string *)&local_578,pcVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_allocated_capacity != &local_568) {
          operator_delete((void *)local_578._M_allocated_capacity,
                          (ulong)(local_568._M_allocated_capacity + 1));
        }
        cmMakefile::ClearMatches(pcVar5);
        if (((TransformAction *)((long)_Var19._M_head_impl + 0x108))->_vptr_TransformAction ==
            (_func_int **)0x0) {
LAB_0027b2d2:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3e8,
                     "sub-command TRANSFORM, action REPLACE: Failed to compile regex \"",0x40);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3e8,
                               *(char **)local_1b0.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                               *(long *)((long)local_1b0.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\".",2);
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar25,(string *)&local_550);
          *(undefined ***)prVar25 = &PTR__runtime_error_0069cd58;
          __cxa_throw(prVar25,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)&((TransformAction *)((long)_Var19._M_head_impl + 0x118))->
                      _vptr_TransformAction == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3e8,"sub-command TRANSFORM, action REPLACE: ",0x27);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3e8,
                               (char *)((TransformAction *)((long)_Var19._M_head_impl + 8))->
                                       _vptr_TransformAction,
                               (long)((TransformAction *)((long)_Var19._M_head_impl + 0x10))->
                                     _vptr_TransformAction);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar25,(string *)&local_550);
          *(undefined ***)prVar25 = &PTR__runtime_error_0069cd58;
          __cxa_throw(prVar25,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )_Stack_198._M_head_impl != (TransformAction *)0x0) {
          TVar6._vptr_TransformAction = (_Stack_198._M_head_impl)->_vptr_TransformAction;
          _Stack_198._M_head_impl = _Var19._M_head_impl;
          (*TVar6._vptr_TransformAction[1])();
          _Var19._M_head_impl = (TransformAction *)_Stack_198;
        }
      }
      _Stack_198._M_head_impl = _Var19._M_head_impl;
      local_578._M_allocated_capacity = (size_type)&local_568;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"REGEX","");
      local_550 = local_540;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"AT","");
      local_168 = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"FOR","");
      local_148 = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"OUTPUT_VARIABLE","");
      _Var22._M_head_impl = local_190._M_head_impl;
LAB_0027a61c:
      do {
        local_190._M_head_impl = _Var22._M_head_impl;
        uVar23 = local_578._8_8_;
        pbVar35 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar7 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar31 = (long)pbVar7 - (long)pbVar35 >> 5;
        if (uVar31 <= uVar32) {
          local_598._0_8_ = (pointer)0x0;
          local_598._8_8_ = (pointer)0x0;
          local_598._16_8_ = (pointer)0x0;
          bVar13 = GetList(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_598,&((Command *)local_1f0)->ListName);
          if (bVar13) {
            if (local_190._M_head_impl == (TransformSelector *)0x0) {
              local_190._M_head_impl = (TransformSelector *)operator_new(0x28);
              (((string *)((long)local_190._M_head_impl + 8))->_M_dataplus)._M_p =
                   (pointer)((long)local_190._M_head_impl + 0x18);
              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_190._M_head_impl + 0x18))->_M_allocated_capacity = 0x43454c4553204f4e
              ;
              *(undefined4 *)((long)local_190._M_head_impl + 0x1f) = 0x524f5443;
              *(undefined1 *)((long)local_190._M_head_impl + 0x23) = 0;
              *(size_type *)((long)local_190._M_head_impl + 0x10) = 0xb;
              ppuVar24 = &PTR__TransformSelector_0069cf08;
              *(undefined ***)local_190._M_head_impl = &PTR__TransformSelector_0069cf08;
            }
            else {
              ppuVar24 = (local_190._M_head_impl)->_vptr_TransformSelector;
            }
            (*((_func_int **)ppuVar24)[4])(local_190._M_head_impl,local_598,&p_Var26[2]._M_parent);
            pcVar5 = (this->super_cmCommand).Makefile;
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)&local_3e8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_598,";");
            cmMakefile::AddDefinition
                      (pcVar5,&((Command *)local_1f0)->OutputName,(char *)local_3e8._M_unused._0_8_)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_unused._0_8_ != &local_3d8) {
              operator_delete(local_3e8._M_unused._M_object,
                              CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                                       CONCAT15(local_3d8._M_local_buf[5],
                                                CONCAT14(local_3d8._M_local_buf[4],
                                                         CONCAT13(local_3d8._M_local_buf[3],
                                                                  CONCAT12(local_3d8._M_local_buf[2]
                                                                           ,CONCAT11(local_3d8.
                                                                                     _M_local_buf[1]
                                                                                     ,local_3d8.
                                                                                      _M_local_buf
                                                                                      [0])))))) + 1)
              ;
            }
          }
          else {
            cmMakefile::AddDefinition
                      ((this->super_cmCommand).Makefile,&((Command *)local_1f0)->OutputName,"");
          }
          bVar13 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_598);
          goto LAB_0027b8db;
        }
        lVar27 = uVar32 * 0x20;
        pbVar2 = pbVar35 + uVar32;
        __n = (pointer)pbVar35[uVar32]._M_string_length;
        if (((((__n == (pointer)local_578._8_8_) &&
              ((__n == (pointer)0x0 ||
               (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,(void *)local_578._M_allocated_capacity,
                              (size_t)__n), iVar15 == 0)))) ||
             ((__n == local_548 &&
              ((__n == (pointer)0x0 ||
               (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,local_550,(size_t)__n), iVar15 == 0))))))
            || ((__n == local_160 &&
                ((__n == (pointer)0x0 ||
                 (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,local_168,(size_t)__n), iVar15 == 0))))))
           && (local_190._M_head_impl != (TransformSelector *)0x0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3e8,"sub-command TRANSFORM, selector already specified (",
                     0x33);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3e8,
                               (((string *)((long)local_190._M_head_impl + 8))->_M_dataplus)._M_p,
                               *(size_type *)((long)local_190._M_head_impl + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,").",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_598);
LAB_0027b1ef:
          if ((pointer)local_598._0_8_ != (pointer)(local_598 + 0x10)) {
LAB_0027b1fd:
            operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
          }
LAB_0027b20a:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)&local_378);
          break;
        }
        if ((__n == (pointer)uVar23) &&
           ((__n == (pointer)0x0 ||
            (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,(void *)local_578._M_allocated_capacity,
                           (size_t)__n), iVar15 == 0)))) {
          uVar1 = uVar32 + 1;
          if (uVar31 == uVar1) {
            local_3e8._M_unused._M_object = &local_3d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3e8,
                       "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                       ,"");
            cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
LAB_0027b268:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_unused._0_8_ != &local_3d8) {
LAB_0027b8c9:
              operator_delete(local_3e8._M_unused._M_object,
                              CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                                       CONCAT15(local_3d8._M_local_buf[5],
                                                CONCAT14(local_3d8._M_local_buf[4],
                                                         CONCAT13(local_3d8._M_local_buf[3],
                                                                  CONCAT12(local_3d8._M_local_buf[2]
                                                                           ,CONCAT11(local_3d8.
                                                                                     _M_local_buf[1]
                                                                                     ,local_3d8.
                                                                                      _M_local_buf
                                                                                      [0])))))) + 1)
              ;
            }
            break;
          }
          _Var22._M_head_impl = (TransformSelector *)operator_new(0xf8);
          local_3e8._M_unused._M_object = &local_3d8;
          local_3d8._M_local_buf[4] = 'X';
          local_3d8._M_local_buf[0] = 'R';
          local_3d8._M_local_buf[1] = 'E';
          local_3d8._M_local_buf[2] = 'G';
          local_3d8._M_local_buf[3] = 'E';
          local_3e8._8_8_ = 5;
          local_3d8._M_local_buf[5] = '\0';
          (((string *)((long)_Var22._M_head_impl + 8))->_M_dataplus)._M_p =
               (pointer)((long)_Var22._M_head_impl + 0x18);
          *(undefined4 *)((long)_Var22._M_head_impl + 0x18) = 0x45474552;
          *(undefined1 *)((long)_Var22._M_head_impl + 0x1c) = 0x58;
          *(ulong *)((long)_Var22._M_head_impl + 0x1d) =
               (ulong)CONCAT52(local_3d8._8_5_,local_3d8._M_allocated_capacity._6_2_) << 8;
          *(undefined2 *)((long)_Var22._M_head_impl + 0x25) = local_3d8._13_2_;
          *(char *)((long)_Var22._M_head_impl + 0x27) = local_3d8._M_local_buf[0xf];
          *(size_type *)((long)_Var22._M_head_impl + 0x10) = 5;
          *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorRegex_0069cd80;
          ((TransformSelector *)((long)_Var22._M_head_impl + 0x28))->_vptr_TransformSelector =
               (_func_int **)0x0;
          ((TransformSelector *)((long)_Var22._M_head_impl + 0x78))->_vptr_TransformSelector =
               (_func_int **)0x0;
          ((TransformSelector *)((long)_Var22._M_head_impl + 200))->_vptr_TransformSelector =
               (_func_int **)0x0;
          *(long *)((long)_Var22._M_head_impl + 0xe8) = 0;
          cmsys::RegularExpression::compile
                    ((RegularExpression *)((long)_Var22._M_head_impl + 0x28),
                     pbVar35[uVar1]._M_dataplus._M_p);
          if (local_190._M_head_impl != (TransformSelector *)0x0) {
            ppp_Var11 = &(local_190._M_head_impl)->_vptr_TransformSelector;
            local_190._M_head_impl = _Var22._M_head_impl;
            (*(*ppp_Var11)[1])();
            _Var22._M_head_impl = local_190._M_head_impl;
          }
          local_190._M_head_impl = _Var22._M_head_impl;
          iVar15 = (*(local_190._M_head_impl)->_vptr_TransformSelector[2])(local_190._M_head_impl,0)
          ;
          if ((char)iVar15 == '\0') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_3e8,
                       "sub-command TRANSFORM, selector REGEX failed to compile regex \"",0x3f);
            pbVar35 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_3e8,pbVar35[uVar1]._M_dataplus._M_p,
                                 pbVar35[uVar1]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\".",2);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_598);
            goto LAB_0027b1ef;
          }
LAB_0027a8c0:
          uVar32 = uVar32 + 2;
          _Var22._M_head_impl = local_190._M_head_impl;
          goto LAB_0027a61c;
        }
        if ((__n != local_548) ||
           ((__n != (pointer)0x0 &&
            (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,local_550,(size_t)__n), iVar15 != 0)))) {
          if ((__n != local_160) ||
             ((__n != (pointer)0x0 &&
              (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,local_168,(size_t)__n), iVar15 != 0)))) {
            if ((__n != local_140) ||
               ((__n != (pointer)0x0 &&
                (iVar15 = bcmp((pbVar2->_M_dataplus)._M_p,local_148,(size_t)__n), iVar15 != 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3e8,"sub-command TRANSFORM, \'",0x18);
              local_120.Begin._M_current =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar32;
              local_120.End._M_current =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        ((string *)local_598,&local_120," ");
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_3e8,(char *)local_598._0_8_,local_598._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar18,"\': unexpected argument(s).",0x1a);
              if ((pointer)local_598._0_8_ != (pointer)(local_598 + 0x10)) {
                operator_delete((void *)local_598._0_8_,(ulong)(local_598._16_8_ + 1));
              }
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)local_598);
              if ((pointer)local_598._0_8_ != (pointer)(local_598 + 0x10)) goto LAB_0027b1fd;
              goto LAB_0027b20a;
            }
            if (uVar31 != uVar32 + 1) {
              std::__cxx11::string::_M_assign((string *)&((Command *)local_1f0)->OutputName);
              goto LAB_0027a8c0;
            }
            local_3e8._M_unused._M_object = &local_3d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3e8,
                       "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
LAB_0027b8bc:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_unused._0_8_ != &local_3d8) goto LAB_0027b8c9;
            break;
          }
          uVar1 = uVar32 + 2;
          if (uVar31 <= uVar1) {
            local_3e8._M_unused._M_object = &local_3d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3e8,
                       "sub-command TRANSFORM, selector FOR expects, at least, two arguments.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
            goto LAB_0027b268;
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pbVar35[uVar32 + 1]._M_dataplus._M_p;
          piVar20 = __errno_location();
          iVar15 = *piVar20;
          *piVar20 = 0;
          lVar27 = strtol(paVar8->_M_local_buf,(char **)&local_3e8,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_unused._0_8_ == paVar8) {
LAB_0027b2ae:
            std::__throw_invalid_argument("stoi");
LAB_0027b2ba:
            std::__throw_out_of_range("stoi");
          }
          else {
            if ((lVar27 - 0x80000000U < 0xffffffff00000000) || (iVar33 = *piVar20, iVar33 == 0x22))
            {
              std::__throw_out_of_range("stoi");
              goto LAB_0027b2ae;
            }
            if (iVar33 == 0) {
              *piVar20 = iVar15;
              iVar33 = iVar15;
            }
            pbVar35 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((long)local_3e8._M_unused._0_8_ - (long)paVar8 !=
                pbVar35[uVar32 + 1]._M_string_length) {
LAB_0027b88c:
              local_3e8._M_unused._M_object = &local_3d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3e8,
                         "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                         ,"");
              cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
              goto LAB_0027b8bc;
            }
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)pbVar35[uVar1]._M_dataplus._M_p;
            *piVar20 = 0;
            lVar21 = strtol(paVar8->_M_local_buf,(char **)&local_3e8,10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_unused._0_8_ != paVar8) {
              local_128 = lVar21;
              if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (iVar15 = *piVar20, iVar15 == 0x22)
                 ) goto LAB_0027b2ba;
              if (iVar15 == 0) {
                *piVar20 = iVar33;
                iVar15 = iVar33;
              }
              pbVar35 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((long)local_3e8._M_unused._0_8_ - (long)paVar8 != pbVar35[uVar1]._M_string_length)
              goto LAB_0027b88c;
              uVar31 = uVar32 + 3;
              if (uVar31 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar35
                                  >> 5)) {
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pbVar35[uVar31]._M_dataplus._M_p;
                *piVar20 = 0;
                lVar21 = strtol(paVar8->_M_local_buf,(char **)&local_3e8,10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_unused._0_8_ == paVar8) {
                  uVar23 = std::__throw_invalid_argument("stoi");
LAB_0027b41e:
                  if ((pointer)local_598._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_598._0_8_,local_598._16_8_ - local_598._0_8_);
                  }
                  if (local_148 != local_138) {
                    operator_delete(local_148,local_138[0] + 1);
                  }
                  if (local_168 != local_158) {
                    operator_delete(local_168,local_158[0] + 1);
                  }
                  if (local_550 != local_540) {
                    operator_delete(local_550,local_540[0] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_578._M_allocated_capacity != &local_568) {
                    operator_delete((void *)local_578._M_allocated_capacity,
                                    (ulong)(local_568._M_allocated_capacity + 1));
                  }
                  std::
                  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                  ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                          *)&local_4f0);
                  HandleTransformCommand::Command::~Command((Command *)local_1f0);
                  _Unwind_Resume(uVar23);
                }
                if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) {
                  uVar23 = std::__throw_out_of_range("stoi");
                  goto LAB_0027b41e;
                }
                if (*piVar20 == 0) {
                  *piVar20 = iVar15;
                }
                iVar15 = 1;
                if ((long)local_3e8._M_unused._0_8_ - (long)paVar8 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar31]._M_string_length) {
                  iVar15 = (int)lVar21;
                  uVar31 = uVar32 + 4;
                  if (iVar15 < 0) {
                    local_3e8._M_unused._M_object = &local_3d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3e8,
                               "sub-command TRANSFORM, selector FOR expects non negative numeric value for <step>."
                               ,"");
                    cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_unused._0_8_ != &local_3d8) {
                      operator_delete(local_3e8._M_unused._M_object,
                                      CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                                               CONCAT15(local_3d8._M_local_buf[5],
                                                        CONCAT14(local_3d8._M_local_buf[4],
                                                                 CONCAT13(local_3d8._M_local_buf[3],
                                                                          CONCAT12(local_3d8.
                                                                                   _M_local_buf[2],
                                                                                   CONCAT11(
                                                  local_3d8._M_local_buf[1],
                                                  local_3d8._M_local_buf[0])))))) + 1);
                    }
                  }
                }
              }
              else {
                iVar15 = 1;
              }
              _Var22._M_head_impl = (TransformSelector *)operator_new(0x50);
              ((_Var22._M_head_impl)->Tag)._M_dataplus._M_p =
                   (pointer)&((_Var22._M_head_impl)->Tag).field_2;
              *(undefined4 *)&((_Var22._M_head_impl)->Tag).field_2 = 0x524f46;
              ((_Var22._M_head_impl)->Tag)._M_string_length = 3;
              _Var22._M_head_impl[1]._vptr_TransformSelector = (_func_int **)0x0;
              _Var22._M_head_impl[1].Tag._M_dataplus._M_p = (pointer)0x0;
              _Var22._M_head_impl[1].Tag._M_string_length = 0;
              (_Var22._M_head_impl)->_vptr_TransformSelector =
                   (_func_int **)&PTR__TransformSelectorIndexes_0069ceb8;
              *(int *)&_Var22._M_head_impl[1].Tag.field_2 = (int)lVar27;
              *(int *)((long)&_Var22._M_head_impl[1].Tag.field_2 + 4) = (int)local_128;
              *(int *)((long)&_Var22._M_head_impl[1].Tag.field_2 + 8) = iVar15;
              uVar32 = uVar31;
              if (local_190._M_head_impl != (TransformSelector *)0x0) {
                lVar27 = *(long *)local_190._M_head_impl;
                local_190._M_head_impl = _Var22._M_head_impl;
                (**(code **)(lVar27 + 8))();
                _Var22._M_head_impl = local_190._M_head_impl;
              }
              goto LAB_0027a61c;
            }
          }
          std::__throw_invalid_argument("stoi");
          goto LAB_0027b2d2;
        }
        local_598._0_8_ = (pointer)0x0;
        local_598._8_8_ = (pointer)0x0;
        local_598._16_8_ = (pointer)0x0;
        uVar32 = uVar32 + 1;
        if (uVar32 < (ulong)((long)pbVar7 - (long)pbVar35 >> 5)) {
          piVar20 = __errno_location();
          do {
            paVar8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)((long)&pbVar35[1]._M_dataplus._M_p + lVar27);
            iVar15 = *piVar20;
            *piVar20 = 0;
            lVar21 = strtol(paVar8->_M_local_buf,(char **)&local_3e8,10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_unused._0_8_ == paVar8) {
              uVar23 = std::__throw_invalid_argument("stoi");
              goto LAB_0027b41e;
            }
            if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) {
              uVar23 = std::__throw_out_of_range("stoi");
              goto LAB_0027b41e;
            }
            if (*piVar20 == 0) {
              *piVar20 = iVar15;
            }
            local_120.Begin._M_current._0_4_ = (int)lVar21;
            if ((long)local_3e8._M_unused._0_8_ - (long)paVar8 !=
                *(long *)((long)&(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length +
                         lVar27)) break;
            if (local_598._8_8_ == local_598._16_8_) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_598,(iterator)local_598._8_8_,
                         (int *)&local_120);
            }
            else {
              *(int *)local_598._8_8_ = (int)lVar21;
              local_598._8_8_ = local_598._8_8_ + 4;
            }
            pbVar35 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar32 = uVar32 + 1;
            lVar27 = lVar27 + 0x20;
          } while (uVar32 < (ulong)((long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pbVar35 >> 5));
        }
        uVar12 = local_598._8_8_;
        uVar23 = local_598._0_8_;
        if (local_598._0_8_ == local_598._8_8_) {
          local_3e8._M_unused._M_object = &local_3d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3e8,
                     "sub-command TRANSFORM, selector AT expects at least one numeric value.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)&local_3e8);
          _Var22._M_head_impl = local_190._M_head_impl;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_unused._0_8_ != &local_3d8) {
            operator_delete(local_3e8._M_unused._M_object,
                            CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                                     CONCAT15(local_3d8._M_local_buf[5],
                                              CONCAT14(local_3d8._M_local_buf[4],
                                                       CONCAT13(local_3d8._M_local_buf[3],
                                                                CONCAT12(local_3d8._M_local_buf[2],
                                                                         CONCAT11(local_3d8.
                                                                                  _M_local_buf[1],
                                                                                  local_3d8.
                                                                                  _M_local_buf[0])))
                                                      ))) + 1);
            _Var22._M_head_impl = local_190._M_head_impl;
          }
        }
        else {
          _Var22._M_head_impl = (TransformSelector *)operator_new(0x40);
          local_3d8._M_local_buf[1] = 'T';
          local_3d8._M_local_buf[2] = '\0';
          (((string *)((long)_Var22._M_head_impl + 8))->_M_dataplus)._M_p =
               (pointer)((long)_Var22._M_head_impl + 0x18);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)_Var22._M_head_impl + 0x18))->_M_allocated_capacity =
               CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                        CONCAT15(local_3d8._M_local_buf[5],
                                 CONCAT14(local_3d8._M_local_buf[4],
                                          CONCAT13(local_3d8._M_local_buf[3],0x5441))));
          *(long *)((long)_Var22._M_head_impl + 0x20) =
               CONCAT17(local_3d8._M_local_buf[0xf],CONCAT25(local_3d8._13_2_,local_3d8._8_5_));
          *(size_type *)((long)_Var22._M_head_impl + 0x10) = 2;
          local_3e8._8_8_ = 0;
          local_3d8._M_local_buf[0] = '\0';
          *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorIndexes_0069ce80;
          local_3e8._M_unused._M_object = &local_3d8;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)((long)_Var22._M_head_impl + 0x28),
                     (vector<int,_std::allocator<int>_> *)local_598);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_unused._0_8_ != &local_3d8) {
            operator_delete(local_3e8._M_unused._M_object,
                            CONCAT26(local_3d8._M_allocated_capacity._6_2_,
                                     CONCAT15(local_3d8._M_local_buf[5],
                                              CONCAT14(local_3d8._M_local_buf[4],
                                                       CONCAT13(local_3d8._M_local_buf[3],
                                                                CONCAT12(local_3d8._M_local_buf[2],
                                                                         CONCAT11(local_3d8.
                                                                                  _M_local_buf[1],
                                                                                  local_3d8.
                                                                                  _M_local_buf[0])))
                                                      ))) + 1);
          }
          *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorIndexes_0069ce18;
          if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               )local_190._M_head_impl != (TransformSelector *)0x0) {
            lVar27 = *(long *)local_190._M_head_impl;
            local_190._M_head_impl = _Var22._M_head_impl;
            (**(code **)(lVar27 + 8))();
            _Var22._M_head_impl = local_190._M_head_impl;
          }
        }
        local_190._M_head_impl = _Var22._M_head_impl;
        if ((pointer)local_598._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_598._0_8_,local_598._16_8_ - local_598._0_8_);
        }
        _Var22._M_head_impl = local_190._M_head_impl;
      } while (uVar23 != uVar12);
      bVar13 = false;
LAB_0027b8db:
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      if (local_550 != local_540) {
        operator_delete(local_550,local_540[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_allocated_capacity != &local_568) {
        operator_delete((void *)local_578._M_allocated_capacity,
                        (ulong)(local_568._M_allocated_capacity + 1));
      }
      goto LAB_0027b963;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3e8,"sub-command TRANSFORM, action ",0x1e);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_3e8,*(char **)(p_Var26 + 1),(long)p_Var26[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," expects ",9);
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,p_Var26[2]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," argument(s).",0xd);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_578);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_allocated_capacity != &local_568) {
    operator_delete((void *)local_578._M_allocated_capacity,
                    (ulong)(local_568._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8._M_pod_data);
  std::ios_base::~ios_base((ios_base *)&local_378);
  bVar13 = false;
LAB_0027b963:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
          *)&local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &(((Command *)local_1f0)->OutputName).field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)local_190._M_head_impl !=
      (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
    (*(local_190._M_head_impl)->_vptr_TransformSelector[1])();
  }
  local_190._M_head_impl = (TransformSelector *)0x0;
  if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
       )_Stack_198._M_head_impl != (TransformAction *)0x0) {
    (*(_Stack_198._M_head_impl)->_vptr_TransformAction[1])();
  }
  _Stack_198._M_head_impl = (TransformAction *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&((Command *)local_1f0)->Arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &(((Command *)local_1f0)->ListName).field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != &(((Command *)local_1f0)->Name).field_2) {
    operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
  }
  return bVar13;
}

Assistant:

bool cmListCommand::HandleTransformCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::TrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    std::ostringstream error;
    error << " sub-command TRANSFORM, " << args[index] << " invalid action.";
    this->SetError(error.str());
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    std::ostringstream error;
    error << "sub-command TRANSFORM, action " << descriptor->Name
          << " expects " << descriptor->Arity << " argument(s).";
    this->SetError(error.str());
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action =
        cm::make_unique<TransformReplace>(command.Arguments, this->Makefile);
    } catch (const transform_error& e) {
      this->SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" }, AT{ "AT" }, FOR{ "FOR" },
    OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, selector already specified ("
            << command.Selector->Tag << ").";
      this->SetError(error.str());
      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, selector REGEX expects "
                       "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        std::ostringstream error;
        error << "sub-command TRANSFORM, selector REGEX failed to compile "
                 "regex \"";
        error << args[index] << "\".";
        this->SetError(error.str());
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        this->SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, at least,"
                       " two arguments.");
        return false;
      }

      int start = 0, stop = 0, step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        this->SetError("sub-command TRANSFORM, selector FOR expects, "
                       "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step < 0) {
        this->SetError("sub-command TRANSFORM, selector FOR expects "
                       "non negative numeric value for <step>.");
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        this->SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                       "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    std::ostringstream error;
    error << "sub-command TRANSFORM, '"
          << cmJoin(cmMakeRange(args).advance(index), " ")
          << "': unexpected argument(s).";
    this->SetError(error.str());
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, command.ListName)) {
    this->Makefile->AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    this->SetError(e.what());
    return false;
  }

  this->Makefile->AddDefinition(command.OutputName,
                                cmJoin(varArgsExpanded, ";").c_str());

  return true;
}